

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitstate.cc
# Opt level: O0

void __thiscall re2::BitState::BitState(BitState *this,Prog *prog)

{
  undefined8 in_RSI;
  undefined8 *in_RDI;
  
  *in_RDI = in_RSI;
  StringPiece::StringPiece((StringPiece *)(in_RDI + 1));
  StringPiece::StringPiece((StringPiece *)(in_RDI + 3));
  *(undefined1 *)(in_RDI + 5) = 0;
  *(undefined1 *)((long)in_RDI + 0x29) = 0;
  *(undefined1 *)((long)in_RDI + 0x2a) = 0;
  in_RDI[6] = 0;
  *(undefined4 *)(in_RDI + 7) = 0;
  PODArray<unsigned_int>::PODArray((PODArray<unsigned_int> *)0x22a474);
  PODArray<const_char_*>::PODArray((PODArray<const_char_*> *)0x22a487);
  PODArray<re2::Job>::PODArray((PODArray<re2::Job> *)0x22a497);
  *(undefined4 *)(in_RDI + 0xe) = 0;
  return;
}

Assistant:

BitState::BitState(Prog* prog)
  : prog_(prog),
    anchored_(false),
    longest_(false),
    endmatch_(false),
    submatch_(NULL),
    nsubmatch_(0),
    njob_(0) {
}